

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

uint32_t load4(uchar *in)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)in[3];
  uVar2 = 2;
  while( true ) {
    if ((int)uVar2 < 0) break;
    uVar1 = uVar1 << 8 | (uint)in[uVar2];
    uVar2 = uVar2 - 1;
  }
  return uVar1;
}

Assistant:

uint32_t load4(const unsigned char * in)
{
	int i;
	uint32_t ret = in[3];

	for (i = 2; i >= 0; i--)
	{
		ret <<= 8;
		ret |= in[i];
	}

	return ret;
}